

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

int __thiscall CImage::LoadBmp(CImage *this,char *szFilename)

{
  int iVar1;
  FILE *pFVar2;
  size_t sVar3;
  unsigned_short local_4d2;
  uint uStack_4d0;
  unsigned_short bits;
  long yres;
  long xres;
  uchar *puStack_4b8;
  short i;
  uchar *pBuf;
  long Dummy;
  long SuffLen;
  long biSize;
  uchar BmpPal [256] [4];
  _BMPIMAGEHEADER ih;
  _BMPIMAGEHEADEROLD ih_old;
  _BMPFILEHEADER fh;
  char *szFilename_local;
  CImage *this_local;
  
  pBuf = (uchar *)0x0;
  pFVar2 = fopen(szFilename,"rb");
  this->f = (FILE *)pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    this_local._4_4_ = 0x1e;
  }
  else {
    sVar3 = fread(&ih_old.biWidth,0xe,1,(FILE *)this->f);
    if (sVar3 == 1) {
      if (ih_old.biWidth == 0x4d42) {
        sVar3 = fread(&SuffLen,4,1,(FILE *)this->f);
        if (sVar3 == 1) {
          if (SuffLen < 0xd) {
            fseek((FILE *)this->f,-4,1);
            sVar3 = fread(&ih.biClrImportant,SuffLen,1,(FILE *)this->f);
            if (sVar3 != 1) {
              return 0x1f;
            }
            yres._0_4_ = (uint)(ushort)ih_old.biSize;
            uStack_4d0 = (uint)ih_old.biSize._2_2_;
            local_4d2 = ih_old.biSize._6_2_;
          }
          else {
            fseek((FILE *)this->f,-4,1);
            sVar3 = fread(BmpPal[0xfe] + 2,SuffLen,1,(FILE *)this->f);
            if (sVar3 != 1) {
              return 0x1f;
            }
            yres._0_4_ = (uint)ih.biSize;
            uStack_4d0 = (uint)ih.biWidth;
            local_4d2 = ih.biHeight._2_2_;
          }
          iVar1 = Init(this,(uint)yres,uStack_4d0,local_4d2);
          if (iVar1 == 0) {
            if (this->m_BitPerPixel == 8) {
              Dummy = (long)(((this->m_Xres + 3) / 4) * 4 - this->m_Xres);
              sVar3 = fread(&biSize,0x400,1,(FILE *)this->f);
              if (sVar3 != 1) {
                return 0x1f;
              }
              for (xres._6_2_ = 0; xres._6_2_ < 0x100; xres._6_2_ = xres._6_2_ + 1) {
                this->m_Pal[xres._6_2_].b = BmpPal[(long)xres._6_2_ + -2][0];
                this->m_Pal[xres._6_2_].g = BmpPal[(long)xres._6_2_ + -2][1];
                this->m_Pal[xres._6_2_].r = BmpPal[(long)xres._6_2_ + -2][2];
              }
              puStack_4b8 = this->m_pBitmap + this->m_NumPixel;
              for (xres._6_2_ = 0; (int)xres._6_2_ < this->m_Yres; xres._6_2_ = xres._6_2_ + 1) {
                puStack_4b8 = puStack_4b8 + -(long)this->m_Xres;
                sVar3 = fread(puStack_4b8,(long)this->m_Xres,1,(FILE *)this->f);
                if (sVar3 != 1) {
                  return 0x1f;
                }
                if ((0 < Dummy) && (sVar3 = fread(&pBuf,Dummy,1,(FILE *)this->f), sVar3 != 1)) {
                  return 0x1f;
                }
              }
            }
            else {
              if (this->m_BitPerPixel != 0x18) {
                return 0x22;
              }
              Dummy = (long)(((this->m_Xres * 3 + 3) / 4) * 4 + this->m_Xres * -3);
              puStack_4b8 = this->m_pBitmap + this->m_NumPixel * 3;
              for (xres._6_2_ = 0; (int)xres._6_2_ < this->m_Yres; xres._6_2_ = xres._6_2_ + 1) {
                puStack_4b8 = puStack_4b8 + -(long)(this->m_Xres * 3);
                sVar3 = fread(puStack_4b8,(long)(this->m_Xres * 3),1,(FILE *)this->f);
                if (sVar3 != 1) {
                  return 0x1f;
                }
                if ((0 < Dummy) && (sVar3 = fread(&pBuf,Dummy,1,(FILE *)this->f), sVar3 != 1)) {
                  return 0x1f;
                }
              }
            }
            fclose((FILE *)this->f);
            this_local._4_4_ = 0;
          }
          else {
            this_local._4_4_ = 0x21;
          }
        }
        else {
          this_local._4_4_ = 0x1f;
        }
      }
      else {
        this_local._4_4_ = 0x20;
      }
    }
    else {
      this_local._4_4_ = 0x1f;
    }
  }
  return this_local._4_4_;
}

Assistant:

int CImage::LoadBmp(char *szFilename)
{
  _BMPFILEHEADER     fh;
  _BMPIMAGEHEADEROLD ih_old;
  _BMPIMAGEHEADER    ih;
  unsigned char      BmpPal[256][4];
  long int           biSize; 
  long int           SuffLen;
  long int           Dummy = 0;
  unsigned char    * pBuf;
  short              i;
  long int           xres, yres;
  unsigned short     bits;

  if (!(f = fopen(szFilename, "rb"))) return eLoadBmpFileOpen;
  if (fread(&fh, 14, 1, f) != 1) return eLoadBmpFileRead;
  if (fh.bfType != 0x4D42) return eLoadBmpBadFormat;
  if (fread(&biSize, 4, 1, f) != 1) return eLoadBmpFileRead;
  if (biSize > 12)
  {
    fseek( f, -4, SEEK_CUR );
    if (fread(&ih, biSize, 1, f) != 1) return eLoadBmpFileRead;
    xres = ih.biWidth;
    yres = ih.biHeight;
    bits = ih.biBitCount;
  }
  else
  {
    fseek( f, -4, SEEK_CUR );
    if (fread(&ih_old, biSize, 1, f) != 1) return eLoadBmpFileRead;
    xres = ih_old.biWidth;
    yres = ih_old.biHeight;
    bits = ih_old.biBitCount;
  }

  if ( Init( xres, yres, bits ) != 0 ) return eLoadBmpInit;
  if (m_BitPerPixel==8)
  {
    SuffLen=((m_Xres+3)/4)*4-m_Xres;
    if (fread(&BmpPal, 1024, 1, f) != 1) return eLoadBmpFileRead;
    for (i=0; i<256; i++)
    {
      m_Pal[i].b=BmpPal[i][0];
      m_Pal[i].g=BmpPal[i][1];
      m_Pal[i].r=BmpPal[i][2];
    }
    pBuf=m_pBitmap;
    pBuf+=m_NumPixel;
    for (i=0; i<m_Yres; i++)
    {
      pBuf-=m_Xres;
      if (fread(pBuf, m_Xres, 1, f) != 1) return eLoadBmpFileRead;
      if (SuffLen>0) 
      { 
        if (fread(&Dummy, SuffLen, 1, f) != 1) return eLoadBmpFileRead; 
      }
    }
  } 
  else
  if (m_BitPerPixel==24)
  {
    SuffLen=((m_Xres*3+3)/4)*4-(m_Xres*3);
    pBuf=m_pBitmap;
    pBuf+=m_NumPixel*3;
    for (i=0; i<m_Yres; i++)
    {
      pBuf-=m_Xres*3;
      if (fread(pBuf, m_Xres*3, 1, f) != 1) return eLoadBmpFileRead;
      if (SuffLen>0) 
      { 
        if (fread(&Dummy, SuffLen, 1, f) != 1) return eLoadBmpFileRead; 
      }
    }
  } 
  else 
    return eLoadBmpColorDepth;

  fclose(f);

  return 0;
}